

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

size_t divide_subset_split(size_t *ix_arr,double *x,size_t st,size_t end,double split_point)

{
  size_t sVar1;
  size_t row;
  size_t st_orig;
  size_t temp;
  double split_point_local;
  size_t end_local;
  size_t st_local;
  double *x_local;
  size_t *ix_arr_local;
  
  st_local = st;
  for (row = st; row <= end; row = row + 1) {
    if (x[row - st] <= split_point) {
      sVar1 = ix_arr[st_local];
      ix_arr[st_local] = ix_arr[row];
      ix_arr[row] = sVar1;
      st_local = st_local + 1;
    }
  }
  return st_local;
}

Assistant:

size_t divide_subset_split(size_t ix_arr[], double x[], size_t st, size_t end, double split_point) noexcept
{
    size_t temp;
    size_t st_orig = st;
    for (size_t row = st_orig; row <= end; row++)
    {
        if (x[row - st_orig] <= split_point)
        {
            temp        = ix_arr[st];
            ix_arr[st]  = ix_arr[row];
            ix_arr[row] = temp;
            st++;
        }
    }
    return st;
}